

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  stbi_uc *psVar8;
  uint uVar9;
  uint uVar10;
  stbi_uc *psVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  ulong uVar25;
  long lVar26;
  stbi_uc *psVar27;
  byte *pbVar28;
  uint uVar29;
  long lVar30;
  stbi_uc *psVar31;
  byte *pbVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  long *in_FS_OFFSET;
  bool bVar36;
  ulong local_c8;
  ulong local_78;
  ulong uVar24;
  
  bVar36 = depth == 0x10;
  uVar4 = x * out_n;
  uVar5 = uVar4 << bVar36;
  a_00 = a->s->img_n;
  lVar33 = (long)a_00;
  uVar35 = (ulong)(uint)(a_00 << bVar36);
  psVar8 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar36,0);
  a->out = psVar8;
  if (psVar8 == (stbi_uc *)0x0) {
    pcVar15 = "outofmem";
  }
  else {
    iVar6 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar6 == 0) {
      pcVar15 = "too large";
    }
    else {
      iVar6 = a_00 * x;
      uVar23 = iVar6 * depth + 7U >> 3;
      uVar24 = (ulong)uVar23;
      if ((uVar23 + 1) * y <= raw_len) {
        if (y != 0) {
          lVar34 = -(ulong)uVar5;
          lVar19 = (long)(out_n << bVar36);
          iVar7 = x - 1;
          lVar30 = *in_FS_OFFSET;
          lVar20 = -lVar19;
          uVar10 = 0;
          local_c8 = 0;
          local_78 = (ulong)x;
          do {
            pbVar32 = raw + 1;
            bVar2 = *raw;
            if ((ulong)bVar2 < 5) {
              psVar8 = a->out + uVar5 * (int)local_c8;
              if (depth < 8) {
                if (x < uVar23) {
                  *(undefined8 *)(lVar30 + -0x20) = "invalid width";
                  bVar36 = false;
                  goto LAB_001bb9b6;
                }
                psVar8 = psVar8 + (uVar4 - uVar23);
                uVar35 = 1;
                local_78 = uVar24;
              }
              if (local_c8 == 0) {
                bVar2 = ""[bVar2];
              }
              iVar16 = (int)uVar35;
              if (0 < iVar16) {
                uVar25 = 0;
                do {
                  switch(bVar2) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar3 = pbVar32[uVar25];
                    goto LAB_001bb474;
                  case 2:
                  case 4:
                    bVar3 = psVar8[uVar25 + lVar34];
                    break;
                  case 3:
                    bVar3 = psVar8[uVar25 + lVar34] >> 1;
                    break;
                  default:
                    goto switchD_001bb45a_default;
                  }
                  bVar3 = bVar3 + pbVar32[uVar25];
LAB_001bb474:
                  psVar8[uVar25] = bVar3;
switchD_001bb45a_default:
                  uVar25 = uVar25 + 1;
                } while (uVar35 != uVar25);
              }
              if (depth == 8) {
                lVar26 = (long)out_n;
                lVar22 = lVar33;
                if (a_00 != out_n) {
                  psVar8[lVar33] = 0xff;
                }
LAB_001bb4c1:
                pbVar32 = pbVar32 + lVar22;
              }
              else {
                if (depth == 0x10) {
                  lVar22 = (long)iVar16;
                  lVar26 = lVar19;
                  if (a_00 != out_n) {
                    (psVar8 + lVar22)[0] = 0xff;
                    (psVar8 + lVar22)[1] = 0xff;
                  }
                  goto LAB_001bb4c1;
                }
                pbVar32 = raw + 2;
                lVar26 = 1;
              }
              psVar31 = psVar8 + lVar26;
              if (a_00 == out_n || depth < 8) {
                uVar9 = ((int)local_78 + -1) * iVar16;
                switch(bVar2) {
                case 0:
                  memcpy(psVar31,pbVar32,(long)(int)uVar9);
                  break;
                case 1:
                  if (0 < (int)uVar9) {
                    uVar25 = 0;
                    do {
                      psVar31[uVar25] = psVar8[uVar25 + (lVar26 - iVar16)] + pbVar32[uVar25];
                      uVar25 = uVar25 + 1;
                    } while (uVar9 != uVar25);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar9) {
                    uVar25 = 0;
                    do {
                      psVar31[uVar25] = psVar31[uVar25 + lVar34] + pbVar32[uVar25];
                      uVar25 = uVar25 + 1;
                    } while (uVar9 != uVar25);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar9) {
                    uVar25 = 0;
                    do {
                      psVar31[uVar25] =
                           (char)((uint)psVar8[uVar25 + (lVar26 - iVar16)] +
                                  (uint)psVar31[uVar25 + lVar34] >> 1) + pbVar32[uVar25];
                      uVar25 = uVar25 + 1;
                    } while (uVar9 != uVar25);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar9) {
                    pbVar28 = psVar8 + (lVar26 - iVar16);
                    uVar25 = 0;
                    do {
                      bVar2 = *pbVar28;
                      bVar3 = psVar31[lVar34];
                      bVar12 = pbVar28[lVar34];
                      iVar16 = ((uint)bVar3 + (uint)bVar2) - (uint)bVar12;
                      uVar29 = iVar16 - (uint)bVar2;
                      uVar14 = -uVar29;
                      if (0 < (int)uVar29) {
                        uVar14 = uVar29;
                      }
                      uVar13 = iVar16 - (uint)bVar3;
                      uVar29 = -uVar13;
                      if (0 < (int)uVar13) {
                        uVar29 = uVar13;
                      }
                      uVar17 = iVar16 - (uint)bVar12;
                      uVar13 = -uVar17;
                      if (0 < (int)uVar17) {
                        uVar13 = uVar17;
                      }
                      if (uVar29 <= uVar13) {
                        bVar12 = bVar3;
                      }
                      if (uVar13 < uVar14) {
                        bVar2 = bVar12;
                      }
                      if (uVar29 < uVar14) {
                        bVar2 = bVar12;
                      }
                      *psVar31 = bVar2 + pbVar32[uVar25];
                      uVar25 = uVar25 + 1;
                      pbVar28 = pbVar28 + 1;
                      psVar31 = psVar31 + 1;
                    } while (uVar9 != uVar25);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar9) {
                    uVar25 = 0;
                    do {
                      psVar31[uVar25] = (psVar8[uVar25 + (lVar26 - iVar16)] >> 1) + pbVar32[uVar25];
                      uVar25 = uVar25 + 1;
                    } while (uVar9 != uVar25);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar9) {
                    uVar25 = 0;
                    do {
                      psVar31[uVar25] = psVar8[uVar25 + (lVar26 - iVar16)] + pbVar32[uVar25];
                      uVar25 = uVar25 + 1;
                    } while (uVar9 != uVar25);
                  }
                }
                pbVar32 = pbVar32 + (int)uVar9;
              }
              else {
                switch(bVar2) {
                case 0:
                  if (iVar7 != 0) {
                    iVar21 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar25 = 0;
                        do {
                          psVar31[uVar25] = pbVar32[uVar25];
                          uVar25 = uVar25 + 1;
                        } while (uVar35 != uVar25);
                      }
                      psVar31[iVar16] = 0xff;
                      pbVar32 = pbVar32 + iVar16;
                      psVar31 = psVar31 + lVar19;
                      iVar21 = iVar21 + -1;
                    } while (iVar21 != 0);
                  }
                  break;
                case 1:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar26 + lVar20;
                    iVar21 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar25 = 0;
                        do {
                          psVar31[uVar25] = psVar8[uVar25] + pbVar32[uVar25];
                          uVar25 = uVar25 + 1;
                        } while (uVar35 != uVar25);
                      }
                      psVar31[iVar16] = 0xff;
                      pbVar32 = pbVar32 + iVar16;
                      psVar31 = psVar31 + lVar19;
                      psVar8 = psVar8 + lVar19;
                      iVar21 = iVar21 + -1;
                    } while (iVar21 != 0);
                  }
                  break;
                case 2:
                  if (iVar7 != 0) {
                    iVar21 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar25 = 0;
                        do {
                          psVar31[uVar25] = psVar31[uVar25 + lVar34] + pbVar32[uVar25];
                          uVar25 = uVar25 + 1;
                        } while (uVar35 != uVar25);
                      }
                      psVar31[iVar16] = 0xff;
                      pbVar32 = pbVar32 + iVar16;
                      psVar31 = psVar31 + lVar19;
                      iVar21 = iVar21 + -1;
                    } while (iVar21 != 0);
                  }
                  break;
                case 3:
                  if (iVar7 != 0) {
                    iVar21 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar25 = 0;
                        psVar8 = psVar31;
                        do {
                          *psVar8 = (char)((uint)psVar8[lVar20] + (uint)psVar8[lVar34] >> 1) +
                                    pbVar32[uVar25];
                          uVar25 = uVar25 + 1;
                          psVar8 = psVar8 + 1;
                        } while (uVar35 != uVar25);
                      }
                      psVar31[iVar16] = 0xff;
                      pbVar32 = pbVar32 + iVar16;
                      psVar31 = psVar31 + lVar19;
                      iVar21 = iVar21 + -1;
                    } while (iVar21 != 0);
                  }
                  break;
                case 4:
                  if (iVar7 != 0) {
                    psVar11 = psVar8 + lVar26 + lVar34;
                    psVar27 = psVar8 + lVar26 + lVar20;
                    psVar8 = psVar8 + lVar26 + (lVar20 - (ulong)uVar5);
                    iVar21 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar25 = 0;
                        do {
                          bVar2 = psVar27[uVar25];
                          bVar3 = psVar11[uVar25];
                          bVar12 = psVar8[uVar25];
                          iVar18 = ((uint)bVar3 + (uint)bVar2) - (uint)bVar12;
                          uVar14 = iVar18 - (uint)bVar2;
                          uVar9 = -uVar14;
                          if (0 < (int)uVar14) {
                            uVar9 = uVar14;
                          }
                          uVar29 = iVar18 - (uint)bVar3;
                          uVar14 = -uVar29;
                          if (0 < (int)uVar29) {
                            uVar14 = uVar29;
                          }
                          uVar13 = iVar18 - (uint)bVar12;
                          uVar29 = -uVar13;
                          if (0 < (int)uVar13) {
                            uVar29 = uVar13;
                          }
                          if (uVar14 <= uVar29) {
                            bVar12 = bVar3;
                          }
                          if (uVar29 < uVar9) {
                            bVar2 = bVar12;
                          }
                          if (uVar14 < uVar9) {
                            bVar2 = bVar12;
                          }
                          psVar31[uVar25] = bVar2 + pbVar32[uVar25];
                          uVar25 = uVar25 + 1;
                        } while (uVar35 != uVar25);
                      }
                      psVar31[iVar16] = 0xff;
                      pbVar32 = pbVar32 + iVar16;
                      psVar31 = psVar31 + lVar19;
                      psVar11 = psVar11 + lVar19;
                      psVar27 = psVar27 + lVar19;
                      psVar8 = psVar8 + lVar19;
                      iVar21 = iVar21 + -1;
                    } while (iVar21 != 0);
                  }
                  break;
                case 5:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar26 + lVar20;
                    iVar21 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar25 = 0;
                        do {
                          psVar31[uVar25] = (psVar8[uVar25] >> 1) + pbVar32[uVar25];
                          uVar25 = uVar25 + 1;
                        } while (uVar35 != uVar25);
                      }
                      psVar31[iVar16] = 0xff;
                      pbVar32 = pbVar32 + iVar16;
                      psVar31 = psVar31 + lVar19;
                      psVar8 = psVar8 + lVar19;
                      iVar21 = iVar21 + -1;
                    } while (iVar21 != 0);
                  }
                  break;
                case 6:
                  if (iVar7 != 0) {
                    psVar8 = psVar8 + lVar26 + lVar20;
                    iVar21 = iVar7;
                    do {
                      if (0 < iVar16) {
                        uVar25 = 0;
                        do {
                          psVar31[uVar25] = psVar8[uVar25] + pbVar32[uVar25];
                          uVar25 = uVar25 + 1;
                        } while (uVar35 != uVar25);
                      }
                      psVar31[iVar16] = 0xff;
                      pbVar32 = pbVar32 + iVar16;
                      psVar31 = psVar31 + lVar19;
                      psVar8 = psVar8 + lVar19;
                      iVar21 = iVar21 + -1;
                    } while (iVar21 != 0);
                  }
                }
                bVar36 = true;
                if (depth == 0x10) {
                  if (x != 0) {
                    psVar8 = a->out + (long)iVar16 + (ulong)uVar10 + 1;
                    uVar25 = (ulong)x;
                    do {
                      *psVar8 = 0xff;
                      psVar8 = psVar8 + lVar19;
                      uVar9 = (int)uVar25 - 1;
                      uVar25 = (ulong)uVar9;
                    } while (uVar9 != 0);
                  }
                  goto LAB_001bb9b6;
                }
              }
              bVar36 = true;
            }
            else {
              *(undefined8 *)(lVar30 + -0x20) = "invalid filter";
              bVar36 = false;
            }
LAB_001bb9b6:
            if (!bVar36) {
              return 0;
            }
            local_c8 = local_c8 + 1;
            uVar10 = uVar10 + uVar5;
            raw = pbVar32;
          } while (local_c8 != y);
        }
        if (7 < depth) {
          if (depth != 0x10) {
            return 1;
          }
          if (uVar4 * y != 0) {
            psVar8 = a->out;
            lVar33 = 0;
            do {
              puVar1 = (ushort *)(psVar8 + lVar33 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar33 = lVar33 + 1;
            } while (uVar4 * y != (int)lVar33);
            return 1;
          }
          return 1;
        }
        if (y == 0) {
          return 1;
        }
        uVar23 = x - 1;
        lVar33 = uVar4 - uVar24;
        lVar30 = (ulong)uVar23 + 1;
        uVar10 = 0;
        uVar35 = 0;
        do {
          bVar2 = 1;
          if (color == 0) {
            bVar2 = ""[depth];
          }
          psVar8 = a->out;
          pbVar28 = psVar8 + uVar5 * (int)uVar35;
          pbVar32 = pbVar28 + (uVar4 - uVar24);
          uVar25 = (ulong)uVar10;
          if (depth == 4) {
            iVar7 = iVar6;
            if (1 < iVar6) {
              psVar31 = psVar8 + lVar33;
              iVar16 = iVar6;
              do {
                psVar8[uVar25] = (psVar31[uVar25] >> 4) * bVar2;
                psVar8[uVar25 + 1] = (psVar31[uVar25] & 0xf) * bVar2;
                iVar7 = iVar16 + -2;
                psVar31 = psVar31 + 1;
                psVar8 = psVar8 + 2;
                bVar36 = 3 < iVar16;
                iVar16 = iVar7;
              } while (bVar36);
              pbVar32 = psVar31 + uVar25;
              pbVar28 = psVar8 + uVar25;
            }
            if (iVar7 == 1) {
              bVar3 = *pbVar32 >> 4;
LAB_001bbcea:
              bVar2 = bVar3 * bVar2;
LAB_001bbced:
              *pbVar28 = bVar2;
            }
          }
          else if (depth == 2) {
            iVar7 = iVar6;
            if (3 < iVar6) {
              psVar31 = psVar8 + lVar33;
              iVar16 = iVar6;
              do {
                psVar8[uVar25] = (psVar31[uVar25] >> 6) * bVar2;
                psVar8[uVar25 + 1] = (psVar31[uVar25] >> 4 & 3) * bVar2;
                psVar8[uVar25 + 2] = (psVar31[uVar25] >> 2 & 3) * bVar2;
                psVar8[uVar25 + 3] = (psVar31[uVar25] & 3) * bVar2;
                iVar7 = iVar16 + -4;
                psVar31 = psVar31 + 1;
                psVar8 = psVar8 + 4;
                bVar36 = 7 < iVar16;
                iVar16 = iVar7;
              } while (bVar36);
              pbVar32 = psVar31 + uVar25;
              pbVar28 = psVar8 + uVar25;
            }
            if (0 < iVar7) {
              *pbVar28 = (*pbVar32 >> 6) * bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (1 < iVar7) {
              *pbVar28 = (*pbVar32 >> 4 & 3) * bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (iVar7 == 3) {
              bVar3 = *pbVar32 >> 2 & 3;
              goto LAB_001bbcea;
            }
          }
          else if (depth == 1) {
            iVar7 = iVar6;
            if (7 < iVar6) {
              psVar31 = psVar8 + lVar33;
              iVar16 = iVar6;
              do {
                psVar8[uVar25] = (char)psVar31[uVar25] >> 7 & bVar2;
                psVar8[uVar25 + 1] = (char)(psVar31[uVar25] * '\x02') >> 7 & bVar2;
                psVar8[uVar25 + 2] = (char)(psVar31[uVar25] << 2) >> 7 & bVar2;
                psVar8[uVar25 + 3] = (char)(psVar31[uVar25] << 3) >> 7 & bVar2;
                psVar8[uVar25 + 4] = (char)(psVar31[uVar25] << 4) >> 7 & bVar2;
                psVar8[uVar25 + 5] = (char)(psVar31[uVar25] << 5) >> 7 & bVar2;
                psVar8[uVar25 + 6] = (char)(psVar31[uVar25] << 6) >> 7 & bVar2;
                bVar3 = bVar2;
                if ((psVar31[uVar25] & 1) == 0) {
                  bVar3 = 0;
                }
                psVar8[uVar25 + 7] = bVar3;
                iVar7 = iVar16 + -8;
                psVar31 = psVar31 + 1;
                psVar8 = psVar8 + 8;
                bVar36 = 0xf < iVar16;
                iVar16 = iVar7;
              } while (bVar36);
              pbVar32 = psVar31 + uVar25;
              pbVar28 = psVar8 + uVar25;
            }
            if (0 < iVar7) {
              *pbVar28 = (char)*pbVar32 >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (1 < iVar7) {
              *pbVar28 = (char)(*pbVar32 * '\x02') >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (2 < iVar7) {
              *pbVar28 = (char)(*pbVar32 << 2) >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (3 < iVar7) {
              *pbVar28 = (char)(*pbVar32 << 3) >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (4 < iVar7) {
              *pbVar28 = (char)(*pbVar32 << 4) >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (5 < iVar7) {
              *pbVar28 = (char)(*pbVar32 << 5) >> 7 & bVar2;
              pbVar28 = pbVar28 + 1;
            }
            if (iVar7 == 7) {
              bVar2 = (char)(*pbVar32 << 6) >> 7 & bVar2;
              goto LAB_001bbced;
            }
          }
          if (a_00 != out_n) {
            psVar8 = a->out;
            if (a_00 == 1) {
              lVar19 = lVar30;
              if (-1 < (int)uVar23) {
                do {
                  psVar8[lVar19 * 2 + (uVar25 - 1)] = 0xff;
                  psVar8[lVar19 * 2 + (uVar25 - 2)] = psVar8[lVar19 + (uVar25 - 1)];
                  lVar20 = lVar19 + -1;
                  bVar36 = 0 < lVar19;
                  lVar19 = lVar20;
                } while (lVar20 != 0 && bVar36);
              }
            }
            else if (-1 < (int)uVar23) {
              psVar31 = psVar8 + (ulong)uVar23 * 3 + 2 + uVar25;
              lVar19 = lVar30;
              do {
                psVar8[lVar19 * 4 + (uVar25 - 1)] = 0xff;
                psVar8[lVar19 * 4 + (uVar25 - 2)] = *psVar31;
                psVar8[lVar19 * 4 + (uVar25 - 3)] = psVar31[-1];
                psVar8[lVar19 * 4 + (uVar25 - 4)] = psVar31[-2];
                psVar31 = psVar31 + -3;
                lVar20 = lVar19 + -1;
                bVar36 = 0 < lVar19;
                lVar19 = lVar20;
              } while (lVar20 != 0 && bVar36);
            }
          }
          uVar35 = uVar35 + 1;
          uVar10 = uVar10 + uVar5;
          if (uVar35 == y) {
            return 1;
          }
        } while( true );
      }
      pcVar15 = "not enough pixels";
    }
  }
  *(char **)(*in_FS_OFFSET + -0x20) = pcVar15;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }